

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int FE_Delete_Previous(FORM *form)

{
  int iVar1;
  FIELD *pFVar2;
  char *pos;
  char *pcVar3;
  char *buf;
  char *buf_00;
  int iVar4;
  
  iVar4 = form->currow;
  iVar1 = form->curcol;
  if (iVar4 == 0 && iVar1 == 0) {
    return -0xc;
  }
  pFVar2 = form->current;
  form->curcol = iVar1 + -1;
  if (iVar1 < 1) {
    form->curcol = iVar1;
    if ((form->status & 4) != 0) {
      return -0xc;
    }
    buf = pFVar2->buf + (iVar4 + -1) * pFVar2->dcols;
    buf_00 = pFVar2->buf + pFVar2->dcols * iVar4;
    Synchronize_Buffer(form);
    pos = After_End_Of_Data(buf,pFVar2->dcols);
    pcVar3 = After_End_Of_Data(buf_00,pFVar2->dcols);
    iVar4 = (int)pcVar3 - (int)buf_00;
    if (((int)buf - (int)pos) + (int)pFVar2->cols < iVar4) {
      return -0xc;
    }
    winsdelln(form->w,0xffffffff);
    Adjust_Cursor_Position(form,pos);
    wmove(form->w,form->currow,form->curcol);
    waddnstr(form->w,buf_00,iVar4);
  }
  else {
    wmove(form->w);
    wdelch(form->w);
  }
  return 0;
}

Assistant:

static int FE_Delete_Previous(FORM * form)
{
  FIELD  *field = form->current;
  
  if (First_Position_In_Current_Field(form))
    return E_REQUEST_DENIED;

  if ( (--(form->curcol))<0 )
    {
      char *this_line, *prev_line, *prev_end, *this_end;
      
      form->curcol++;
      if (form->status & _OVLMODE) 
        return E_REQUEST_DENIED;
      
      prev_line = Address_Of_Row_In_Buffer(field,(form->currow-1));
      this_line = Address_Of_Row_In_Buffer(field,(form->currow));
      Synchronize_Buffer(form);
      prev_end = After_End_Of_Data(prev_line,field->dcols);
      this_end = After_End_Of_Data(this_line,field->dcols);
      if ((int)(this_end-this_line) > 
          (field->cols-(int)(prev_end-prev_line))) 
        return E_REQUEST_DENIED;
      wdeleteln(form->w);
      Adjust_Cursor_Position(form,prev_end);
      wmove(form->w,form->currow,form->curcol);
      waddnstr(form->w,this_line,(int)(this_end-this_line));
    } 
  else 
    {
      wmove(form->w,form->currow,form->curcol);
      wdelch(form->w);
    }
  return E_OK;
}